

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxequilisc.hpp
# Opt level: O0

double soplex::maxPrescaledRatio<double>
                 (SPxLPBase<double> *lp,vector<double,_std::allocator<double>_> *coScaleval,
                 bool rowRatio)

{
  int iVar1;
  undefined8 *puVar2;
  double *pdVar3;
  char *pcVar4;
  const_reference pvVar5;
  element_type *this;
  byte in_DL;
  int __c;
  vector<double,_std::allocator<double>_> *in_RSI;
  Real RVar6;
  SPxLPBase<double> *pSVar7;
  double p;
  double x;
  int j;
  double maxi;
  double mini;
  SVectorBase<double> *vec;
  int i;
  int n;
  double pmax;
  SPxLPBase<double> *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  byte in_stack_ffffffffffffff47;
  SVectorBase<double> *local_88;
  int local_7c;
  uint local_44;
  SPxLPBase<double> *local_40;
  SPxLPBase<double> *local_38;
  int local_28;
  double local_20;
  
  local_20 = 0.0;
  if ((in_DL & 1) == 0) {
    local_7c = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x13f538);
  }
  else {
    local_7c = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x13f525);
  }
  for (local_28 = 0; local_28 < local_7c; local_28 = local_28 + 1) {
    iVar1 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
    if ((in_DL & 1) == 0) {
      local_88 = SPxLPBase<double>::colVector
                           ((SPxLPBase<double> *)
                            CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),iVar1);
    }
    else {
      local_88 = SPxLPBase<double>::rowVector
                           ((SPxLPBase<double> *)
                            CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),iVar1);
    }
    puVar2 = (undefined8 *)infinity();
    local_38 = (SPxLPBase<double> *)*puVar2;
    local_40 = (SPxLPBase<double> *)0x0;
    for (local_44 = 0; iVar1 = SVectorBase<double>::size(local_88), (int)local_44 < iVar1;
        local_44 = local_44 + 1) {
      pdVar3 = SVectorBase<double>::value(local_88,local_44);
      RVar6 = spxAbs<double>(*pdVar3);
      pcVar4 = SVectorBase<double>::index(local_88,(char *)(ulong)local_44,__c);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_RSI,(ulong)pcVar4 & 0xffffffff);
      pSVar7 = (SPxLPBase<double> *)(RVar6 * *pvVar5);
      SPxLPBase<double>::tolerances(in_stack_ffffffffffffff38);
      this = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x13f693);
      Tolerances::epsilon(this);
      in_stack_ffffffffffffff47 =
           isZero<double,double>
                     ((double)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                      (double)in_stack_ffffffffffffff38);
      std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x13f6c2);
      if ((in_stack_ffffffffffffff47 & 1) == 0) {
        if ((double)pSVar7 < (double)local_38) {
          local_38 = pSVar7;
        }
        if ((double)local_40 < (double)pSVar7) {
          local_40 = pSVar7;
        }
      }
    }
    in_stack_ffffffffffffff38 = local_38;
    pdVar3 = (double *)infinity();
    if ((((double)in_stack_ffffffffffffff38 != *pdVar3) ||
        (NAN((double)in_stack_ffffffffffffff38) || NAN(*pdVar3))) &&
       (local_20 < (double)local_40 / (double)local_38)) {
      local_20 = (double)local_40 / (double)local_38;
    }
  }
  return local_20;
}

Assistant:

static R maxPrescaledRatio(const SPxLPBase<R>& lp, const std::vector<R>& coScaleval, bool rowRatio)
{
   R pmax = 0.0;
   const int n = rowRatio ? lp.nRows() : lp.nCols();

   for(int i = 0; i < n; ++i)
   {
      const SVectorBase<R>& vec = rowRatio ? lp.rowVector(i) : lp.colVector(i);
      R mini = R(infinity);
      R maxi = 0.0;

      for(int j = 0; j < vec.size(); ++j)
      {
         assert(vec.index(j) >= 0);
         const R x = spxAbs(vec.value(j)) * coScaleval[unsigned(vec.index(j))];

         if(isZero(x, lp.tolerances()->epsilon()))
            continue;

         if(x < mini)
            mini = x;

         if(x > maxi)
            maxi = x;
      }

      if(mini == R(infinity))
         continue;

      const R p = maxi / mini;

      if(p > pmax)
         pmax = p;
   }

   return pmax;
}